

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall sznet::Timer::Timer(Timer *this,TimerCallback *cb,Timestamp when,double interval)

{
  __int_type_conflict1 _Var1;
  double interval_local;
  TimerCallback *cb_local;
  Timer *this_local;
  Timestamp when_local;
  
  MinHeaBaseElem::MinHeaBaseElem(&this->super_MinHeaBaseElem);
  std::function<void_()>::function(&this->m_callback,cb);
  (this->m_expiration).m_microSecondsSinceEpoch = when.m_microSecondsSinceEpoch;
  this->m_interval = interval;
  this->m_repeat = 0.0 < interval;
  _Var1 = std::__atomic_base<unsigned_long>::operator++
                    ((__atomic_base<unsigned_long> *)&m_s_numCreated,0);
  this->m_sequence = _Var1;
  return;
}

Assistant:

Timer(net::TimerCallback cb, Timestamp when, double interval): 
		m_callback(std::move(cb)),
		m_expiration(when),
		m_interval(interval),
		m_repeat(interval > 0.0),
		m_sequence(m_s_numCreated++)
	{ 
	}